

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityMarking.cpp
# Opt level: O2

KString * __thiscall
KDIS::DATA_TYPE::EntityMarking::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,EntityMarking *this)

{
  ostream *poVar1;
  KINT32 Value;
  KStringStream ss;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Entity Marking:");
  poVar1 = std::operator<<(poVar1,"\n\tMaring Char Set:      ");
  ENUMS::GetEnumAsStringEntityMarkingCharacterSet_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui8EntityMarkingCharacterSet,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n\tMarking String:       ");
  GetEntityMarkingString_abi_cxx11_(&local_1e0,this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString EntityMarking::GetAsString() const
{
    KStringStream ss;

    ss << "Entity Marking:"
       << "\n\tMaring Char Set:      " << GetEnumAsStringEntityMarkingCharacterSet( m_ui8EntityMarkingCharacterSet )
       << "\n\tMarking String:       " << GetEntityMarkingString()
       << "\n";

    return ss.str();
}